

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_avx2.c
# Opt level: O1

void cdef_find_dir_dual_avx2
               (uint16_t *img1,uint16_t *img2,int stride,int32_t *var_out_1st,int32_t *var_out_2nd,
               int coeff_shift,int *out_dir_1st_8x8,int *out_dir_2nd_8x8)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ushort uVar5;
  ushort uVar6;
  undefined1 auVar7 [32];
  long lVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  int32_t cost_second_8x8 [8];
  int32_t cost_first_8x8 [8];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  undefined1 local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  
  lVar8 = 0;
  auVar18._8_2_ = 0xff80;
  auVar18._0_8_ = 0xff80ff80ff80ff80;
  auVar18._10_2_ = 0xff80;
  auVar18._12_2_ = 0xff80;
  auVar18._14_2_ = 0xff80;
  auVar18._16_2_ = 0xff80;
  auVar18._18_2_ = 0xff80;
  auVar18._20_2_ = 0xff80;
  auVar18._22_2_ = 0xff80;
  auVar18._24_2_ = 0xff80;
  auVar18._26_2_ = 0xff80;
  auVar18._28_2_ = 0xff80;
  auVar18._30_2_ = 0xff80;
  lVar11 = 0;
  do {
    auVar12._0_16_ =
         ZEXT116(0) * *(undefined1 (*) [16])((long)img2 + lVar11) +
         ZEXT116(1) * *(undefined1 (*) [16])((long)img1 + lVar11);
    auVar12._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) * *(undefined1 (*) [16])((long)img2 + lVar11);
    auVar12 = vpsraw_avx2(auVar12,ZEXT416((uint)coeff_shift));
    auVar12 = vpaddw_avx2(auVar12,auVar18);
    *(undefined1 (*) [32])(local_2c0 + lVar8) = auVar12;
    lVar11 = lVar11 + (long)stride * 2;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0x100);
  auVar18 = vpslldq_avx2(local_2c0,0xe);
  auVar12 = vpsrldq_avx2(local_2c0,2);
  auVar20 = vpslldq_avx2(local_2a0,0xc);
  auVar18 = vpaddw_avx2(auVar20,auVar18);
  auVar20 = vpsrldq_avx2(local_2a0,4);
  auVar12 = vpaddw_avx2(auVar20,auVar12);
  local_e0 = local_2c0;
  local_100 = local_2a0;
  local_140 = local_280;
  auVar20 = vpaddw_avx2(local_2a0,local_2c0);
  auVar13 = vpslldq_avx2(local_280,10);
  auVar15 = vpsrldq_avx2(local_280,6);
  auVar21 = vpslldq_avx2(local_260,8);
  auVar13 = vpaddw_avx2(auVar13,auVar21);
  auVar18 = vpaddw_avx2(auVar18,auVar13);
  auVar13 = vpsrldq_avx2(local_260,8);
  auVar13 = vpaddw_avx2(auVar15,auVar13);
  auVar12 = vpaddw_avx2(auVar12,auVar13);
  local_120 = local_260;
  auVar13 = vpaddw_avx2(local_260,local_280);
  auVar15 = vpslldq_avx2(auVar20,10);
  auVar21 = vpslldq_avx2(auVar13,8);
  auVar15 = vpaddw_avx2(auVar21,auVar15);
  auVar21 = vpslldq_avx2(auVar20,4);
  auVar16 = vpslldq_avx2(auVar13,6);
  auVar21 = vpaddw_avx2(auVar16,auVar21);
  auVar16 = vpslldq_avx2(local_240,6);
  auVar14 = vpsrldq_avx2(local_240,10);
  auVar25 = vpslldq_avx2(local_220,4);
  auVar16 = vpaddw_avx2(auVar25,auVar16);
  auVar25 = vpsrldq_avx2(local_220,0xc);
  auVar14 = vpaddw_avx2(auVar14,auVar25);
  local_160 = local_240;
  auVar25 = vpsrldq_avx2(local_200,0xe);
  auVar14 = vpaddw_avx2(auVar25,auVar14);
  auVar25 = vpaddw_avx2(local_220,local_240);
  auVar12 = vpaddw_avx2(auVar14,auVar12);
  auVar16 = vpaddw_avx2(local_1e0,auVar16);
  auVar18 = vpaddw_avx2(auVar18,auVar16);
  auVar14 = vpslldq_avx2(auVar25,6);
  auVar16 = vpslldq_avx2(local_200,2);
  auVar18 = vpaddw_avx2(auVar18,auVar16);
  auVar16 = vpaddw_avx2(local_200,local_1e0);
  auVar26 = vpslldq_avx2(auVar16,4);
  auVar14 = vpaddw_avx2(auVar26,auVar14);
  auVar15 = vpaddw_avx2(auVar15,auVar14);
  auVar14 = vpslldq_avx2(auVar25,8);
  auVar26 = vpslldq_avx2(auVar16,10);
  auVar14 = vpaddw_avx2(auVar26,auVar14);
  auVar21 = vpaddw_avx2(auVar21,auVar14);
  auVar14 = vpaddw_avx2(auVar13,auVar20);
  auVar26 = vpaddw_avx2(auVar25,auVar16);
  auVar14 = vpaddw_avx2(auVar26,auVar14);
  auVar12 = vpshufb_avx2(auVar12,_DAT_00569d40);
  auVar26 = vpunpcklwd_avx2(auVar18,auVar12);
  auVar12 = vpunpckhwd_avx2(auVar18,auVar12);
  auVar18 = vpmaddwd_avx2(auVar26,auVar26);
  auVar12 = vpmaddwd_avx2(auVar12,auVar12);
  local_60._16_16_ = _DAT_00568500;
  local_60._0_16_ = _DAT_00568500;
  auVar18 = vpmulld_avx2(auVar18,local_60);
  local_80._16_16_ = _DAT_00568510;
  local_80._0_16_ = _DAT_00568510;
  auVar12 = vpmulld_avx2(auVar12,local_80);
  auVar26 = vpaddd_avx2(auVar18,auVar12);
  auVar18 = vpshufb_avx2(auVar20,_DAT_00569d60);
  auVar24._16_16_ = _DAT_00569d00;
  auVar24._0_16_ = _DAT_00569d00;
  auVar12 = vpshufb_avx2(auVar13,auVar24);
  auVar18 = vpaddw_avx2(auVar12,auVar18);
  auVar22._16_16_ = _DAT_00568520;
  auVar22._0_16_ = _DAT_00568520;
  auVar12 = vpshufb_avx2(auVar25,auVar22);
  auVar17._16_16_ = _DAT_00568530;
  auVar17._0_16_ = _DAT_00568530;
  auVar7 = vpshufb_avx2(auVar16,auVar17);
  auVar12 = vpaddw_avx2(auVar12,auVar7);
  auVar18 = vpaddw_avx2(auVar18,auVar12);
  auVar7 = vpunpcklwd_avx2(auVar21,auVar18);
  auVar12 = vpunpckhwd_avx2(auVar21,auVar18);
  auVar18 = vpmaddwd_avx2(auVar7,auVar7);
  auVar12 = vpmaddwd_avx2(auVar12,auVar12);
  local_c0._16_16_ = _DAT_00568540;
  local_c0._0_16_ = _DAT_00568540;
  local_a0._16_16_ = _DAT_00568550;
  local_a0._0_16_ = _DAT_00568550;
  auVar18 = vpmulld_avx2(auVar18,local_c0);
  auVar12 = vpmulld_avx2(auVar12,local_a0);
  auVar21 = vpaddd_avx2(auVar12,auVar18);
  auVar18 = vpshufb_avx2(auVar20,auVar17);
  auVar12 = vpshufb_avx2(auVar13,auVar22);
  auVar18 = vpaddw_avx2(auVar12,auVar18);
  auVar12 = vpshufb_avx2(auVar25,auVar24);
  auVar20 = vpshufb_avx2(auVar16,_DAT_00569d60);
  auVar12 = vpaddw_avx2(auVar12,auVar20);
  auVar18 = vpaddw_avx2(auVar18,auVar12);
  auVar20 = vpunpcklwd_avx2(auVar15,auVar18);
  auVar12 = vpunpckhwd_avx2(auVar15,auVar18);
  auVar18 = vpmaddwd_avx2(auVar20,auVar20);
  auVar12 = vpmaddwd_avx2(auVar12,auVar12);
  auVar18 = vpmulld_avx2(auVar18,local_c0);
  auVar12 = vpmulld_avx2(auVar12,local_a0);
  auVar18 = vpaddd_avx2(auVar12,auVar18);
  auVar13 = vpunpckldq_avx2(auVar26,auVar18);
  auVar12 = vpunpckhdq_avx2(auVar26,auVar18);
  auVar18 = vpmaddwd_avx2(auVar14,auVar14);
  auVar19._8_4_ = 0x69;
  auVar19._0_8_ = 0x6900000069;
  auVar19._12_4_ = 0x69;
  auVar19._16_4_ = 0x69;
  auVar19._20_4_ = 0x69;
  auVar19._24_4_ = 0x69;
  auVar19._28_4_ = 0x69;
  auVar18 = vpmulld_avx2(auVar18,auVar19);
  auVar15 = vpunpckldq_avx2(auVar18,auVar21);
  auVar20 = vpunpckhdq_avx2(auVar18,auVar21);
  auVar21 = vpunpcklqdq_avx2(auVar13,auVar15);
  auVar18 = vpunpckhqdq_avx2(auVar13,auVar15);
  auVar13 = vpunpcklqdq_avx2(auVar12,auVar20);
  auVar18 = vpaddd_avx2(auVar18,auVar13);
  auVar12 = vpunpckhqdq_avx2(auVar12,auVar20);
  auVar12 = vpaddd_avx2(auVar21,auVar12);
  auVar7 = vpaddd_avx2(auVar12,auVar18);
  auVar15 = vpunpcklwd_avx2(local_2c0,local_2a0);
  auVar18 = vpunpckhwd_avx2(local_2c0,local_2a0);
  auVar21 = vpunpcklwd_avx2(local_280,local_260);
  auVar12 = vpunpckhwd_avx2(local_280,local_260);
  auVar16 = vpunpcklwd_avx2(local_240,local_220);
  auVar20 = vpunpckhwd_avx2(local_240,local_220);
  auVar14 = vpunpcklwd_avx2(local_200,local_1e0);
  auVar13 = vpunpckhwd_avx2(local_200,local_1e0);
  auVar25 = vpunpckldq_avx2(auVar15,auVar21);
  auVar15 = vpunpckhdq_avx2(auVar15,auVar21);
  auVar26 = vpunpckldq_avx2(auVar16,auVar14);
  auVar21 = vpunpckhdq_avx2(auVar16,auVar14);
  auVar16 = vpunpckldq_avx2(auVar18,auVar12);
  auVar18 = vpunpckhdq_avx2(auVar18,auVar12);
  auVar14 = vpunpckldq_avx2(auVar20,auVar13);
  auVar12 = vpunpckhdq_avx2(auVar20,auVar13);
  auVar17 = vpunpcklqdq_avx2(auVar25,auVar26);
  auVar25 = vpunpckhqdq_avx2(auVar25,auVar26);
  auVar22 = vpunpcklqdq_avx2(auVar15,auVar21);
  auVar26 = vpunpckhqdq_avx2(auVar15,auVar21);
  auVar27 = vpunpcklqdq_avx2(auVar16,auVar14);
  auVar15 = vpunpckhqdq_avx2(auVar16,auVar14);
  auVar21 = vpunpcklqdq_avx2(auVar18,auVar12);
  auVar13 = vpunpckhqdq_avx2(auVar18,auVar12);
  auVar16 = vpslldq_avx2(auVar13,0xe);
  auVar20 = vpsrldq_avx2(auVar13,2);
  auVar12 = vpslldq_avx2(auVar18,0xc);
  auVar18 = vpsrldq_avx2(auVar21,4);
  auVar18 = vpaddw_avx2(auVar18,auVar20);
  auVar20 = vpslldq_avx2(auVar15,10);
  auVar12 = vpaddw_avx2(auVar12,auVar20);
  auVar12 = vpaddw_avx2(auVar12,auVar16);
  auVar20 = vpsrldq_avx2(auVar15,6);
  auVar16 = vpsrldq_avx2(auVar27,8);
  auVar20 = vpaddw_avx2(auVar20,auVar16);
  auVar13 = vpaddw_avx2(auVar21,auVar13);
  auVar15 = vpaddw_avx2(auVar27,auVar15);
  auVar21 = vpslldq_avx2(auVar13,10);
  auVar16 = vpslldq_avx2(auVar15,8);
  auVar21 = vpaddw_avx2(auVar16,auVar21);
  auVar16 = vpslldq_avx2(auVar13,4);
  auVar14 = vpslldq_avx2(auVar15,6);
  auVar16 = vpaddw_avx2(auVar14,auVar16);
  auVar14 = vpslldq_avx2(auVar27,8);
  auVar27 = vpslldq_avx2(auVar26,6);
  auVar14 = vpaddw_avx2(auVar27,auVar14);
  auVar27 = vpsrldq_avx2(auVar26,10);
  auVar20 = vpaddw_avx2(auVar20,auVar27);
  auVar27 = vpslldq_avx2(auVar22,4);
  auVar14 = vpaddw_avx2(auVar27,auVar14);
  auVar27 = vpsrldq_avx2(auVar22,0xc);
  auVar20 = vpaddw_avx2(auVar20,auVar27);
  auVar27 = vpsrldq_avx2(auVar25,0xe);
  auVar20 = vpaddw_avx2(auVar20,auVar27);
  auVar18 = vpaddw_avx2(auVar20,auVar18);
  auVar27 = vpslldq_avx2(auVar25,2);
  auVar20 = vpaddw_avx2(auVar17,auVar14);
  auVar20 = vpaddw_avx2(auVar20,auVar27);
  auVar12 = vpaddw_avx2(auVar12,auVar20);
  auVar20 = vpaddw_avx2(auVar22,auVar26);
  auVar14 = vpaddw_avx2(auVar17,auVar25);
  auVar25 = vpslldq_avx2(auVar20,6);
  auVar26 = vpslldq_avx2(auVar14,4);
  auVar25 = vpaddw_avx2(auVar25,auVar26);
  auVar21 = vpaddw_avx2(auVar25,auVar21);
  auVar25 = vpslldq_avx2(auVar20,8);
  auVar26 = vpslldq_avx2(auVar14,10);
  auVar25 = vpaddw_avx2(auVar25,auVar26);
  auVar16 = vpaddw_avx2(auVar25,auVar16);
  auVar25 = vpaddw_avx2(auVar15,auVar13);
  auVar26 = vpaddw_avx2(auVar20,auVar14);
  auVar25 = vpaddw_avx2(auVar26,auVar25);
  auVar18 = vpshufb_avx2(auVar18,_DAT_00569d40);
  auVar17 = vpunpcklwd_avx2(auVar12,auVar18);
  auVar26 = vpunpckhwd_avx2(auVar12,auVar18);
  auVar18 = vpmaddwd_avx2(auVar17,auVar17);
  auVar12 = vpmulld_avx2(auVar18,local_60);
  auVar18 = vpmaddwd_avx2(auVar26,auVar26);
  auVar18 = vpmulld_avx2(auVar18,local_80);
  auVar26 = vpaddd_avx2(auVar12,auVar18);
  auVar28._16_16_ = _DAT_00569d10;
  auVar28._0_16_ = _DAT_00569d10;
  auVar18 = vpshufb_avx2(auVar13,auVar28);
  auVar29._16_16_ = _DAT_00569d00;
  auVar29._0_16_ = _DAT_00569d00;
  auVar12 = vpshufb_avx2(auVar15,auVar29);
  auVar18 = vpaddw_avx2(auVar12,auVar18);
  auVar23._16_16_ = _DAT_00568520;
  auVar23._0_16_ = _DAT_00568520;
  auVar12 = vpshufb_avx2(auVar20,auVar23);
  auVar27._16_16_ = _DAT_00568530;
  auVar27._0_16_ = _DAT_00568530;
  auVar17 = vpshufb_avx2(auVar14,auVar27);
  auVar12 = vpaddw_avx2(auVar12,auVar17);
  auVar18 = vpaddw_avx2(auVar18,auVar12);
  auVar17 = vpunpcklwd_avx2(auVar16,auVar18);
  auVar12 = vpunpckhwd_avx2(auVar16,auVar18);
  auVar18 = vpmaddwd_avx2(auVar17,auVar17);
  auVar12 = vpmaddwd_avx2(auVar12,auVar12);
  auVar18 = vpmulld_avx2(auVar18,local_c0);
  auVar12 = vpmulld_avx2(auVar12,local_a0);
  auVar16 = vpaddd_avx2(auVar12,auVar18);
  auVar18 = vpshufb_avx2(auVar13,auVar27);
  auVar12 = vpshufb_avx2(auVar15,auVar23);
  auVar18 = vpaddw_avx2(auVar12,auVar18);
  auVar12 = vpshufb_avx2(auVar20,auVar29);
  auVar20 = vpshufb_avx2(auVar14,auVar28);
  auVar12 = vpaddw_avx2(auVar12,auVar20);
  auVar18 = vpaddw_avx2(auVar18,auVar12);
  auVar12 = vpunpcklwd_avx2(auVar21,auVar18);
  auVar20 = vpunpckhwd_avx2(auVar21,auVar18);
  auVar18 = vpmaddwd_avx2(auVar12,auVar12);
  auVar12 = vpmulld_avx2(auVar18,local_c0);
  auVar18 = vpmaddwd_avx2(auVar20,auVar20);
  auVar18 = vpmulld_avx2(auVar18,local_a0);
  auVar18 = vpaddd_avx2(auVar18,auVar12);
  auVar12 = vpmaddwd_avx2(auVar25,auVar25);
  auVar12 = vpmulld_avx2(auVar12,auVar19);
  auVar13 = vpunpckldq_avx2(auVar26,auVar18);
  auVar20 = vpunpckhdq_avx2(auVar26,auVar18);
  auVar18 = vpunpckldq_avx2(auVar12,auVar16);
  auVar12 = vpunpckhdq_avx2(auVar12,auVar16);
  auVar15 = vpunpcklqdq_avx2(auVar13,auVar18);
  auVar18 = vpunpckhqdq_avx2(auVar13,auVar18);
  auVar13 = vpunpcklqdq_avx2(auVar20,auVar12);
  auVar18 = vpaddd_avx2(auVar18,auVar13);
  local_170 = auVar7._0_16_;
  auVar12 = vpunpckhqdq_avx2(auVar20,auVar12);
  local_190 = auVar7._16_16_;
  auVar12 = vpaddd_avx2(auVar15,auVar12);
  auVar18 = vpaddd_avx2(auVar12,auVar18);
  local_180 = auVar18._0_16_;
  auVar12 = vpmaxsd_avx2(auVar18,auVar7);
  auVar20 = vpshufd_avx2(auVar12,0x4e);
  auVar12 = vpmaxsd_avx2(auVar12,auVar20);
  auVar20 = vpshufd_avx2(auVar12,0x39);
  auVar12 = vpmaxsd_avx2(auVar12,auVar20);
  local_1a0 = auVar18._16_16_;
  auVar2 = vpcmpeqd_avx(auVar7._0_16_,auVar12._0_16_);
  auVar3 = vpcmpeqd_avx(auVar12._0_16_,auVar18._0_16_);
  auVar2 = vpackssdw_avx(auVar3,auVar2);
  auVar3 = vpcmpeqd_avx(auVar12._16_16_,auVar7._16_16_);
  auVar4 = vpcmpeqd_avx(auVar12._16_16_,auVar18._16_16_);
  auVar3 = vpackssdw_avx(auVar4,auVar3);
  auVar2 = vpacksswb_avx(auVar2,auVar2);
  uVar5 = (ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 | (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3
          | (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 | (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6
          | (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 | (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9
          | (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar2[0xf] >> 7) << 0xf;
  auVar2 = vpacksswb_avx(auVar3,auVar3);
  uVar6 = (ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 | (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3
          | (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 | (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6
          | (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 | (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9
          | (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar2[0xf] >> 7) << 0xf;
  uVar9 = uVar5 - 1 ^ (uint)uVar5;
  uVar1 = 0x1f;
  if (uVar9 != 0) {
    for (; uVar9 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  uVar10 = uVar6 - 1 ^ (uint)uVar6;
  uVar9 = 0x1f;
  if (uVar10 != 0) {
    for (; uVar10 >> uVar9 == 0; uVar9 = uVar9 - 1) {
    }
  }
  *var_out_1st = auVar12._0_4_ - *(int *)(local_180 + (ulong)(uVar1 & 7 ^ 4) * 4);
  *var_out_2nd = auVar12._16_4_ - *(int *)(local_1a0 + (ulong)(uVar9 & 7 ^ 4) * 4);
  *var_out_1st = *var_out_1st >> 10;
  *var_out_2nd = *var_out_2nd >> 10;
  *out_dir_1st_8x8 = uVar1;
  *out_dir_2nd_8x8 = uVar9;
  return;
}

Assistant:

void cdef_find_dir_dual_avx2(const uint16_t *img1, const uint16_t *img2,
                             int stride, int32_t *var_out_1st,
                             int32_t *var_out_2nd, int coeff_shift,
                             int *out_dir_1st_8x8, int *out_dir_2nd_8x8) {
  int32_t cost_first_8x8[8];
  int32_t cost_second_8x8[8];
  // Used to store the best cost for 2 8x8's.
  int32_t best_cost[2] = { 0 };
  // Best direction for 2 8x8's.
  int best_dir[2] = { 0 };

  const __m128i const_coeff_shift_reg = _mm_cvtsi32_si128(coeff_shift);
  const __m256i const_128_reg = _mm256_set1_epi16(128);
  __m256i lines[8];
  for (int i = 0; i < 8; i++) {
    const __m128i src_1 = _mm_loadu_si128((const __m128i *)&img1[i * stride]);
    const __m128i src_2 = _mm_loadu_si128((const __m128i *)&img2[i * stride]);

    lines[i] = _mm256_insertf128_si256(_mm256_castsi128_si256(src_1), src_2, 1);
    lines[i] = _mm256_sub_epi16(
        _mm256_sra_epi16(lines[i], const_coeff_shift_reg), const_128_reg);
  }

  /* Compute "mostly vertical" directions. */
  const __m256i dir47 =
      compute_directions_avx2(lines, cost_first_8x8 + 4, cost_second_8x8 + 4);

  /* Transpose and reverse the order of the lines. */
  array_reverse_transpose_8x8_avx2(lines, lines);

  /* Compute "mostly horizontal" directions. */
  const __m256i dir03 =
      compute_directions_avx2(lines, cost_first_8x8, cost_second_8x8);

  __m256i max = _mm256_max_epi32(dir03, dir47);
  max =
      _mm256_max_epi32(max, _mm256_or_si256(_mm256_srli_si256(max, 8),
                                            _mm256_slli_si256(max, 16 - (8))));
  max =
      _mm256_max_epi32(max, _mm256_or_si256(_mm256_srli_si256(max, 4),
                                            _mm256_slli_si256(max, 16 - (4))));

  const __m128i first_8x8_output = _mm256_castsi256_si128(max);
  const __m128i second_8x8_output = _mm256_extractf128_si256(max, 1);
  const __m128i cmpeg_res_00 =
      _mm_cmpeq_epi32(first_8x8_output, _mm256_castsi256_si128(dir47));
  const __m128i cmpeg_res_01 =
      _mm_cmpeq_epi32(first_8x8_output, _mm256_castsi256_si128(dir03));
  const __m128i cmpeg_res_10 =
      _mm_cmpeq_epi32(second_8x8_output, _mm256_extractf128_si256(dir47, 1));
  const __m128i cmpeg_res_11 =
      _mm_cmpeq_epi32(second_8x8_output, _mm256_extractf128_si256(dir03, 1));
  const __m128i t_first_8x8 = _mm_packs_epi32(cmpeg_res_01, cmpeg_res_00);
  const __m128i t_second_8x8 = _mm_packs_epi32(cmpeg_res_11, cmpeg_res_10);

  best_cost[0] = _mm_cvtsi128_si32(_mm256_castsi256_si128(max));
  best_cost[1] = _mm_cvtsi128_si32(second_8x8_output);
  best_dir[0] = _mm_movemask_epi8(_mm_packs_epi16(t_first_8x8, t_first_8x8));
  best_dir[0] =
      get_msb(best_dir[0] ^ (best_dir[0] - 1));  // Count trailing zeros
  best_dir[1] = _mm_movemask_epi8(_mm_packs_epi16(t_second_8x8, t_second_8x8));
  best_dir[1] =
      get_msb(best_dir[1] ^ (best_dir[1] - 1));  // Count trailing zeros

  /* Difference between the optimal variance and the variance along the
     orthogonal direction. Again, the sum(x^2) terms cancel out. */
  *var_out_1st = best_cost[0] - cost_first_8x8[(best_dir[0] + 4) & 7];
  *var_out_2nd = best_cost[1] - cost_second_8x8[(best_dir[1] + 4) & 7];

  /* We'd normally divide by 840, but dividing by 1024 is close enough
  for what we're going to do with this. */
  *var_out_1st >>= 10;
  *var_out_2nd >>= 10;
  *out_dir_1st_8x8 = best_dir[0];
  *out_dir_2nd_8x8 = best_dir[1];
}